

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O0

int OPENSSL_tm_to_posix(tm *tm,int64_t *out)

{
  int iVar1;
  int64_t *out_local;
  tm *tm_local;
  
  iVar1 = posix_time_from_utc((long)tm->tm_year + 0x76c,(long)tm->tm_mon + 1,(long)tm->tm_mday,
                              (long)tm->tm_hour,(long)tm->tm_min,(long)tm->tm_sec,out);
  return iVar1;
}

Assistant:

int OPENSSL_tm_to_posix(const struct tm *tm, int64_t *out) {
  return posix_time_from_utc(tm->tm_year + INT64_C(1900),
                             tm->tm_mon + INT64_C(1), tm->tm_mday, tm->tm_hour,
                             tm->tm_min, tm->tm_sec, out);
}